

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSImporter::ParseMainChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  uint _limit;
  Chunk chunk;
  Chunk local_1e;
  
  do {
    do {
      if ((uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current) < 6) {
        return;
      }
      ReadChunk(this,&local_1e);
    } while ((int)(local_1e.Size - 6) < 1);
    this_00 = this->stream;
    _limit = StreamReader<false,_false>::SetReadLimit
                       (this_00,(local_1e.Size - 6) +
                                (*(int *)&this_00->current - *(int *)&this_00->buffer));
    if (local_1e.Flag == 0x4d4d) {
LAB_003bc0cc:
      ParseEditorChunk(this);
    }
    else if (local_1e.Flag == 0xc23d) {
      this->bIsPrj = true;
      goto LAB_003bc0cc;
    }
    this->stream->current = this->stream->limit;
    StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
    if (*(int *)&this->stream->limit == *(int *)&this->stream->current) {
      return;
    }
  } while( true );
}

Assistant:

void Discreet3DSImporter::ParseMainChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {

    case Discreet3DS::CHUNK_PRJ:
        bIsPrj = true;
    case Discreet3DS::CHUNK_MAIN:
        ParseEditorChunk();
        break;
    };

    ASSIMP_3DS_END_CHUNK();
    // recursively continue processing this hierarchy level
    return ParseMainChunk();
}